

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

QByteArray * __thiscall QProcess::readAllStandardError(QProcess *this)

{
  QProcessPrivate *pQVar1;
  QMessageLogger *in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  ProcessChannel tmp;
  QProcessPrivate *d;
  QByteArray *data;
  QIODevice *in_stack_00000058;
  undefined4 in_stack_ffffffffffffff68;
  ProcessChannel in_stack_ffffffffffffff6c;
  QProcess *in_stack_ffffffffffffff70;
  QByteArray *this_00;
  QByteArray *file;
  QByteArray local_40;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  file = in_RDI;
  pQVar1 = d_func((QProcess *)0x791ae2);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)0x791b16);
  if (pQVar1->processChannelMode == '\x01') {
    QMessageLogger::QMessageLogger
              (in_RSI,(char *)file,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    QMessageLogger::warning(&local_28,"QProcess::readAllStandardError: Called with MergedChannels");
  }
  else {
    readChannel(in_stack_ffffffffffffff70);
    setReadChannel(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    QIODevice::readAll(in_stack_00000058);
    this_00 = &local_40;
    QByteArray::operator=
              (this_00,(QByteArray *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    QByteArray::~QByteArray((QByteArray *)0x791bc3);
    setReadChannel((QProcess *)this_00,in_stack_ffffffffffffff6c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return file;
}

Assistant:

QByteArray QProcess::readAllStandardError()
{
    Q_D(QProcess);
    QByteArray data;
    if (d->processChannelMode == MergedChannels) {
        qWarning("QProcess::readAllStandardError: Called with MergedChannels");
    } else {
        ProcessChannel tmp = readChannel();
        setReadChannel(StandardError);
        data = readAll();
        setReadChannel(tmp);
    }
    return data;
}